

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void WindowSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  long lVar1;
  undefined8 uVar2;
  ImGuiContext *this;
  ImGuiID IVar3;
  int iVar4;
  int iVar5;
  ImGuiWindow **ppIVar6;
  char *pcVar7;
  bool bVar8;
  ImGuiWindowSettings *local_70;
  char *settings_name;
  ImGuiWindowSettings *settings_1;
  ImVec2ih local_50;
  ImVec2 local_4c;
  ImVec2ih local_44;
  ImGuiWindowSettings *local_40;
  ImGuiWindowSettings *settings;
  ImGuiWindow *window;
  ImGuiContext *pIStack_28;
  int i;
  ImGuiContext *g;
  ImGuiTextBuffer *buf_local;
  ImGuiSettingsHandler *handler_local;
  ImGuiContext *ctx_local;
  
  window._4_4_ = 0;
  pIStack_28 = ctx;
  g = (ImGuiContext *)buf;
  buf_local = (ImGuiTextBuffer *)handler;
  handler_local = (ImGuiSettingsHandler *)ctx;
  do {
    this = g;
    if (window._4_4_ == (pIStack_28->Windows).Size) {
      iVar4 = ImGuiTextBuffer::size((ImGuiTextBuffer *)g);
      iVar5 = ImChunkStream<ImGuiWindowSettings>::size(&pIStack_28->SettingsWindows);
      ImGuiTextBuffer::reserve((ImGuiTextBuffer *)this,iVar4 + iVar5 * 6);
      for (settings_name =
                (char *)ImChunkStream<ImGuiWindowSettings>::begin(&pIStack_28->SettingsWindows);
          settings_name != (char *)0x0;
          settings_name =
               (char *)ImChunkStream<ImGuiWindowSettings>::next_chunk
                                 (&pIStack_28->SettingsWindows,(ImGuiWindowSettings *)settings_name)
          ) {
        pcVar7 = ImGuiWindowSettings::GetName((ImGuiWindowSettings *)settings_name);
        uVar2._0_4_ = (buf_local->Buf).Size;
        uVar2._4_4_ = (buf_local->Buf).Capacity;
        ImGuiTextBuffer::appendf((ImGuiTextBuffer *)g,"[%s][%s]\n",uVar2,pcVar7);
        if ((*(int *)(settings_name + 0x10) != 0) && (*(int *)(settings_name + 0x10) != 0x11111111))
        {
          ImGuiTextBuffer::appendf
                    ((ImGuiTextBuffer *)g,"ViewportPos=%d,%d\n",
                     (ulong)(uint)(int)*(short *)(settings_name + 0xc),
                     (ulong)(uint)(int)*(short *)(settings_name + 0xe));
          ImGuiTextBuffer::appendf
                    ((ImGuiTextBuffer *)g,"ViewportId=0x%08X\n",
                     (ulong)*(uint *)(settings_name + 0x10));
        }
        if (((*(short *)(settings_name + 4) != 0) || (*(short *)(settings_name + 6) != 0)) ||
           (*(int *)(settings_name + 0x10) == 0x11111111)) {
          ImGuiTextBuffer::appendf
                    ((ImGuiTextBuffer *)g,"Pos=%d,%d\n",
                     (ulong)(uint)(int)*(short *)(settings_name + 4),
                     (ulong)(uint)(int)*(short *)(settings_name + 6));
        }
        if ((*(short *)(settings_name + 8) != 0) || (*(short *)(settings_name + 10) != 0)) {
          ImGuiTextBuffer::appendf
                    ((ImGuiTextBuffer *)g,"Size=%d,%d\n",
                     (ulong)(uint)(int)*(short *)(settings_name + 8),
                     (ulong)(uint)(int)*(short *)(settings_name + 10));
        }
        ImGuiTextBuffer::appendf
                  ((ImGuiTextBuffer *)g,"Collapsed=%d\n",(ulong)(settings_name[0x1e] & 1));
        if (*(int *)(settings_name + 0x14) != 0) {
          if (*(short *)(settings_name + 0x1c) == -1) {
            ImGuiTextBuffer::appendf
                      ((ImGuiTextBuffer *)g,"DockId=0x%08X\n",(ulong)*(uint *)(settings_name + 0x14)
                      );
          }
          else {
            ImGuiTextBuffer::appendf
                      ((ImGuiTextBuffer *)g,"DockId=0x%08X,%d\n",
                       (ulong)*(uint *)(settings_name + 0x14),
                       (ulong)(uint)(int)*(short *)(settings_name + 0x1c));
          }
          if (*(int *)(settings_name + 0x18) != 0) {
            ImGuiTextBuffer::appendf
                      ((ImGuiTextBuffer *)g,"ClassId=0x%08X\n",
                       (ulong)*(uint *)(settings_name + 0x18));
          }
        }
        ImGuiTextBuffer::append((ImGuiTextBuffer *)g,"\n",(char *)0x0);
      }
      return;
    }
    ppIVar6 = ImVector<ImGuiWindow_*>::operator[](&pIStack_28->Windows,window._4_4_);
    settings = (ImGuiWindowSettings *)*ppIVar6;
    if ((((ImGuiWindow *)settings)->Flags & 0x100U) == 0) {
      if (((ImGuiWindow *)settings)->SettingsOffset == -1) {
        local_70 = ImGui::FindWindowSettings(((ImGuiWindow *)settings)->ID);
      }
      else {
        local_70 = ImChunkStream<ImGuiWindowSettings>::ptr_from_offset
                             (&pIStack_28->SettingsWindows,((ImGuiWindow *)settings)->SettingsOffset
                             );
      }
      local_40 = local_70;
      if (local_70 == (ImGuiWindowSettings *)0x0) {
        local_40 = ImGui::CreateNewWindowSettings(*(char **)settings);
        IVar3 = ImChunkStream<ImGuiWindowSettings>::offset_from_ptr
                          (&pIStack_28->SettingsWindows,local_40);
        settings[0x18].ID = IVar3;
      }
      if ((ImVec2ih)local_40->ID != settings->Size) {
        __assert_fail("settings->ID == window->ID",
                      "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                      ,0x2a0c,
                      "void WindowSettingsHandler_WriteAll(ImGuiContext *, ImGuiSettingsHandler *, ImGuiTextBuffer *)"
                     );
      }
      local_4c = operator-((ImVec2 *)&settings[2].Size,(ImVec2 *)&settings[1].DockOrder);
      ImVec2ih::ImVec2ih(&local_44,&local_4c);
      local_40->Pos = local_44;
      ImVec2ih::ImVec2ih(&local_50,(ImVec2 *)&settings[2].ClassId);
      local_40->Size = local_50;
      local_40->ViewportId = settings[1].ClassId;
      ImVec2ih::ImVec2ih((ImVec2ih *)((long)&settings_1 + 4),(ImVec2 *)&settings[1].DockOrder);
      local_40->ViewportPos = settings_1._4_4_;
      lVar1._0_4_ = settings[0x22].ClassId;
      lVar1._4_2_ = settings[0x22].DockOrder;
      lVar1._6_1_ = settings[0x22].Collapsed;
      lVar1._7_1_ = settings[0x22].WantApply;
      bVar8 = true;
      if (lVar1 != 0) {
        bVar8 = **(ImVec2ih **)&settings[0x22].ClassId == settings[0x23].Size;
      }
      if (!bVar8) {
        __assert_fail("window->DockNode == __null || window->DockNode->ID == window->DockId",
                      "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                      ,0x2a11,
                      "void WindowSettingsHandler_WriteAll(ImGuiContext *, ImGuiSettingsHandler *, ImGuiTextBuffer *)"
                     );
      }
      local_40->DockId = (ImGuiID)settings[0x23].Size;
      local_40->ClassId = settings->DockId;
      local_40->DockOrder = (short)settings[0x24].ID;
      local_40->Collapsed = (bool)(*(byte *)((long)&settings[5].ClassId + 2) & 1);
    }
    window._4_4_ = window._4_4_ + 1;
  } while( true );
}

Assistant:

static void WindowSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsOffset != -1) ? g.SettingsWindows.ptr_from_offset(window->SettingsOffset) : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsOffset = g.SettingsWindows.offset_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = ImVec2ih(window->Pos - window->ViewportPos);
        settings->Size = ImVec2ih(window->SizeFull);
        settings->ViewportId = window->ViewportId;
        settings->ViewportPos = ImVec2ih(window->ViewportPos);
        IM_ASSERT(window->DockNode == NULL || window->DockNode->ID == window->DockId);
        settings->DockId = window->DockId;
        settings->ClassId = window->WindowClass.ClassId;
        settings->DockOrder = window->DockOrder;
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.size() * 6); // ballpark reserve
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
    {
        const char* settings_name = settings->GetName();
        buf->appendf("[%s][%s]\n", handler->TypeName, settings_name);
        if (settings->ViewportId != 0 && settings->ViewportId != ImGui::IMGUI_VIEWPORT_DEFAULT_ID)
        {
            buf->appendf("ViewportPos=%d,%d\n", settings->ViewportPos.x, settings->ViewportPos.y);
            buf->appendf("ViewportId=0x%08X\n", settings->ViewportId);
        }
        if (settings->Pos.x != 0 || settings->Pos.y != 0 || settings->ViewportId == ImGui::IMGUI_VIEWPORT_DEFAULT_ID)
            buf->appendf("Pos=%d,%d\n", settings->Pos.x, settings->Pos.y);
        if (settings->Size.x != 0 || settings->Size.y != 0)
            buf->appendf("Size=%d,%d\n", settings->Size.x, settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        if (settings->DockId != 0)
        {
            // Write DockId as 4 digits if possible. Automatic DockId are small numbers, but full explicit DockSpace() are full ImGuiID range.
            if (settings->DockOrder == -1)
                buf->appendf("DockId=0x%08X\n", settings->DockId);
            else
                buf->appendf("DockId=0x%08X,%d\n", settings->DockId, settings->DockOrder);
            if (settings->ClassId != 0)
                buf->appendf("ClassId=0x%08X\n", settings->ClassId);
        }
        buf->append("\n");
    }
}